

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D2xNvmFlash.cpp
# Opt level: O0

void __thiscall D2xNvmFlash::command(D2xNvmFlash *this,uint8_t cmd)

{
  uint32_t uVar1;
  FlashCmdError *this_00;
  uint8_t cmd_local;
  D2xNvmFlash *this_local;
  
  waitReady(this);
  writeReg(this,'\0',cmd | 0xa500);
  waitReady(this);
  uVar1 = readReg(this,'\x14');
  if ((uVar1 & 2) != 0) {
    writeReg(this,'\x14',2);
    this_00 = (FlashCmdError *)__cxa_allocate_exception(8);
    FlashCmdError::FlashCmdError(this_00);
    __cxa_throw(this_00,&FlashCmdError::typeinfo,FlashCmdError::~FlashCmdError);
  }
  return;
}

Assistant:

void
D2xNvmFlash::command(uint8_t cmd)
{
    waitReady();

    writeReg(NVM_REG_CTRLA, CMDEX_KEY | cmd);

    waitReady();

    if (readReg(NVM_REG_INTFLAG) & 0x2)
    {
        // Clear the error bit
        writeReg(NVM_REG_INTFLAG, 0x2);
        throw FlashCmdError();
    }
}